

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

int cmcmd_cmake_ninja_depends(const_iterator argBeg,const_iterator argEnd)

{
  _Rb_tree_header *p_Var1;
  _Alloc_hider m2;
  bool bVar2;
  int iVar3;
  Value *pVVar4;
  Value *this;
  ostream *poVar5;
  _Base_ptr p_Var6;
  size_type sVar7;
  uint uVar8;
  string *this_00;
  char *m1;
  const_iterator cVar9;
  Value ddi;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string arg_pp;
  string arg_ddi;
  string arg_tdi;
  string arg_obj;
  string arg_dep;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  defines;
  cmFortranSourceInfo info;
  Value local_438;
  Value local_410;
  Value local_3e8;
  cmGeneratedFileStream ddif;
  cmFortranParser parser;
  
  arg_tdi._M_dataplus._M_p = (pointer)&arg_tdi.field_2;
  arg_tdi._M_string_length = 0;
  arg_tdi.field_2._M_local_buf[0] = '\0';
  arg_pp._M_dataplus._M_p = (pointer)&arg_pp.field_2;
  arg_pp._M_string_length = 0;
  arg_dep._M_dataplus._M_p = (pointer)&arg_dep.field_2;
  arg_dep._M_string_length = 0;
  arg_pp.field_2._M_local_buf[0] = '\0';
  arg_dep.field_2._M_local_buf[0] = '\0';
  arg_obj._M_dataplus._M_p = (pointer)&arg_obj.field_2;
  arg_obj._M_string_length = 0;
  arg_ddi._M_dataplus._M_p = (pointer)&arg_ddi.field_2;
  arg_ddi._M_string_length = 0;
  arg_obj.field_2._M_local_buf[0] = '\0';
  arg_ddi.field_2._M_local_buf[0] = '\0';
  uVar8 = 1;
  for (; argBeg._M_current != argEnd._M_current; argBeg._M_current = argBeg._M_current + 1) {
    bVar2 = cmHasLiteralPrefix<std::__cxx11::string,7ul>(argBeg._M_current,(char (*) [7])0x56e19a);
    if (bVar2) {
      std::__cxx11::string::substr((ulong)&ddif,(ulong)argBeg._M_current);
      this_00 = &arg_tdi;
    }
    else {
      bVar2 = cmHasLiteralPrefix<std::__cxx11::string,6ul>(argBeg._M_current,(char (*) [6])0x56d900)
      ;
      if (bVar2) {
        std::__cxx11::string::substr((ulong)&ddif,(ulong)argBeg._M_current);
        this_00 = &arg_pp;
      }
      else {
        bVar2 = cmHasLiteralPrefix<std::__cxx11::string,7ul>
                          (argBeg._M_current,(char (*) [7])0x56d930);
        if (bVar2) {
          std::__cxx11::string::substr((ulong)&ddif,(ulong)argBeg._M_current);
          this_00 = &arg_dep;
        }
        else {
          bVar2 = cmHasLiteralPrefix<std::__cxx11::string,7ul>
                            (argBeg._M_current,(char (*) [7])0x56d961);
          if (bVar2) {
            std::__cxx11::string::substr((ulong)&ddif,(ulong)argBeg._M_current);
            this_00 = &arg_obj;
          }
          else {
            bVar2 = cmHasLiteralPrefix<std::__cxx11::string,7ul>
                              (argBeg._M_current,(char (*) [7])0x56d992);
            if (!bVar2) {
              cmSystemTools::Error
                        ("-E cmake_ninja_depends unknown argument: ",
                         ((argBeg._M_current)->_M_dataplus)._M_p,(char *)0x0,(char *)0x0);
              goto LAB_003aaa9a;
            }
            std::__cxx11::string::substr((ulong)&ddif,(ulong)argBeg._M_current);
            this_00 = &arg_ddi;
          }
        }
      }
    }
    std::__cxx11::string::operator=((string *)this_00,(string *)&ddif);
    std::__cxx11::string::~string((string *)&ddif);
  }
  if (arg_tdi._M_string_length == 0) {
    m1 = "-E cmake_ninja_depends requires value for --tdi=";
  }
  else if (arg_pp._M_string_length == 0) {
    m1 = "-E cmake_ninja_depends requires value for --pp=";
  }
  else if (arg_dep._M_string_length == 0) {
    m1 = "-E cmake_ninja_depends requires value for --dep=";
  }
  else if (arg_obj._M_string_length == 0) {
    m1 = "-E cmake_ninja_depends requires value for --obj=";
  }
  else {
    if (arg_ddi._M_string_length != 0) {
      includes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      includes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      includes.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Json::Value::Value((Value *)&info,nullValue);
      std::ifstream::ifstream(&ddif,arg_tdi._M_dataplus._M_p,_S_in|_S_bin);
      Json::Reader::Reader((Reader *)&parser);
      bVar2 = Json::Reader::parse((Reader *)&parser,(istream *)&ddif,(Value *)&info,false);
      m2 = arg_tdi._M_dataplus;
      if (bVar2) {
        Json::Reader::~Reader((Reader *)&parser);
        std::ifstream::~ifstream(&ddif);
        pVVar4 = Json::Value::operator[]((Value *)&info,"include-dirs");
        bVar2 = Json::Value::isArray(pVVar4);
        if (bVar2) {
          cVar9 = Json::Value::begin(pVVar4);
          parser.IncludePath.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)cVar9.super_ValueIteratorBase.current_._M_node;
          parser.IncludePath.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_1_ = cVar9.super_ValueIteratorBase.isNull_;
          while( true ) {
            cVar9 = Json::Value::end(pVVar4);
            ddif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
            _vptr_basic_ostream = (_func_int **)cVar9.super_ValueIteratorBase.current_._M_node;
            ddif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_1_ =
                 cVar9.super_ValueIteratorBase.isNull_;
            bVar2 = Json::ValueIteratorBase::operator!=
                              ((ValueIteratorBase *)&parser,(SelfType *)&ddif);
            if (!bVar2) break;
            this = Json::ValueIteratorBase::deref((ValueIteratorBase *)&parser);
            Json::Value::asString_abi_cxx11_((string *)&ddif,this);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &includes,(string *)&ddif);
            std::__cxx11::string::~string((string *)&ddif);
            Json::ValueIteratorBase::increment((ValueIteratorBase *)&parser);
          }
        }
        Json::Value::~Value((Value *)&info);
        info.Source._M_dataplus._M_p = (pointer)&info.Source.field_2;
        info.Source._M_string_length = 0;
        info.Source.field_2._M_local_buf[0] = '\0';
        info.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &info.Provides._M_t._M_impl.super__Rb_tree_header._M_header;
        info.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        info.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        info.Provides._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        info.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &info.Requires._M_t._M_impl.super__Rb_tree_header._M_header;
        info.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        info.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        info.Requires._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        p_Var1 = &info.Includes._M_t._M_impl.super__Rb_tree_header;
        info.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        info.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        info.Includes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        defines._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &defines._M_t._M_impl.super__Rb_tree_header._M_header;
        defines._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        defines._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        defines._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        defines._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             defines._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        info.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             info.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        info.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             info.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        info.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        info.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
        cmFortranParser_s::cmFortranParser_s(&parser,&includes,&defines,&info);
        bVar2 = cmFortranParser_FilePush(&parser,arg_pp._M_dataplus._M_p);
        if (bVar2) {
          iVar3 = cmFortran_yyparse(parser.Scanner);
          if (iVar3 != 0) goto LAB_003aad08;
          cmGeneratedFileStream::cmGeneratedFileStream(&ddif,arg_dep._M_dataplus._M_p,false,None);
          cmsys::SystemTools::ConvertToUnixOutputPath((string *)&ddi,&arg_pp);
          poVar5 = std::operator<<((ostream *)&ddif,(string *)&ddi);
          std::operator<<(poVar5,":");
          std::__cxx11::string::~string((string *)&ddi);
          for (p_Var6 = info.Includes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var6 != p_Var1;
              p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
            poVar5 = std::operator<<((ostream *)&ddif," \\\n ");
            cmsys::SystemTools::ConvertToUnixOutputPath((string *)&ddi,(string *)(p_Var6 + 1));
            std::operator<<(poVar5,(string *)&ddi);
            std::__cxx11::string::~string((string *)&ddi);
          }
          std::operator<<((ostream *)&ddif,"\n");
          cmGeneratedFileStream::~cmGeneratedFileStream(&ddif);
          Json::Value::Value(&ddi,objectValue);
          Json::Value::Value(&local_3e8,&arg_obj);
          pVVar4 = Json::Value::operator[](&ddi,"object");
          Json::Value::operator=(pVVar4,&local_3e8);
          Json::Value::~Value(&local_3e8);
          Json::Value::Value(&local_410,arrayValue);
          pVVar4 = Json::Value::operator[](&ddi,"provides");
          pVVar4 = Json::Value::operator=(pVVar4,&local_410);
          Json::Value::~Value(&local_410);
          for (p_Var6 = info.Provides._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var6 != &info.Provides._M_t._M_impl.super__Rb_tree_header;
              p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
            Json::Value::Value((Value *)&ddif,(string *)(p_Var6 + 1));
            Json::Value::append(pVVar4,(Value *)&ddif);
            Json::Value::~Value((Value *)&ddif);
          }
          Json::Value::Value(&local_438,arrayValue);
          pVVar4 = Json::Value::operator[](&ddi,"requires");
          pVVar4 = Json::Value::operator=(pVVar4,&local_438);
          Json::Value::~Value(&local_438);
          for (p_Var6 = info.Requires._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var6 != &info.Requires._M_t._M_impl.super__Rb_tree_header;
              p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
            sVar7 = std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(&info.Provides,(key_type *)(p_Var6 + 1));
            if (sVar7 == 0) {
              Json::Value::Value((Value *)&ddif,(string *)(p_Var6 + 1));
              Json::Value::append(pVVar4,(Value *)&ddif);
              Json::Value::~Value((Value *)&ddif);
            }
          }
          cmGeneratedFileStream::cmGeneratedFileStream(&ddif,arg_ddi._M_dataplus._M_p,false,None);
          Json::operator<<((ostream *)&ddif,&ddi);
          bVar2 = ((&ddif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                     field_0x20)
                   [(long)ddif.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream[-3]] & 5) != 0;
          if (bVar2) {
            cmSystemTools::Error
                      ("-E cmake_ninja_depends failed to write ",arg_ddi._M_dataplus._M_p,
                       (char *)0x0,(char *)0x0);
          }
          uVar8 = (uint)bVar2;
          cmGeneratedFileStream::~cmGeneratedFileStream(&ddif);
          Json::Value::~Value(&ddi);
        }
        else {
          cmSystemTools::Error
                    ("-E cmake_ninja_depends failed to open ",arg_pp._M_dataplus._M_p,(char *)0x0,
                     (char *)0x0);
LAB_003aad08:
          uVar8 = 1;
        }
        cmFortranParser_s::~cmFortranParser_s(&parser);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&defines._M_t);
        cmFortranSourceInfo::~cmFortranSourceInfo(&info);
      }
      else {
        Json::Reader::getFormattedErrorMessages_abi_cxx11_((string *)&defines,(Reader *)&parser);
        cmSystemTools::Error
                  ("-E cmake_ninja_depends failed to parse ",m2._M_p,
                   (char *)defines._M_t._M_impl._0_8_,(char *)0x0);
        std::__cxx11::string::~string((string *)&defines);
        Json::Reader::~Reader((Reader *)&parser);
        std::ifstream::~ifstream(&ddif);
        Json::Value::~Value((Value *)&info);
        uVar8 = 1;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&includes);
      goto LAB_003aaa9a;
    }
    m1 = "-E cmake_ninja_depends requires value for --ddi=";
  }
  cmSystemTools::Error(m1,(char *)0x0,(char *)0x0,(char *)0x0);
LAB_003aaa9a:
  std::__cxx11::string::~string((string *)&arg_ddi);
  std::__cxx11::string::~string((string *)&arg_obj);
  std::__cxx11::string::~string((string *)&arg_dep);
  std::__cxx11::string::~string((string *)&arg_pp);
  std::__cxx11::string::~string((string *)&arg_tdi);
  return uVar8;
}

Assistant:

int cmcmd_cmake_ninja_depends(std::vector<std::string>::const_iterator argBeg,
                              std::vector<std::string>::const_iterator argEnd)
{
  std::string arg_tdi;
  std::string arg_pp;
  std::string arg_dep;
  std::string arg_obj;
  std::string arg_ddi;
  for (std::vector<std::string>::const_iterator a = argBeg; a != argEnd; ++a) {
    std::string const& arg = *a;
    if (cmHasLiteralPrefix(arg, "--tdi=")) {
      arg_tdi = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--pp=")) {
      arg_pp = arg.substr(5);
    } else if (cmHasLiteralPrefix(arg, "--dep=")) {
      arg_dep = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--obj=")) {
      arg_obj = arg.substr(6);
    } else if (cmHasLiteralPrefix(arg, "--ddi=")) {
      arg_ddi = arg.substr(6);
    } else {
      cmSystemTools::Error("-E cmake_ninja_depends unknown argument: ",
                           arg.c_str());
      return 1;
    }
  }
  if (arg_tdi.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --tdi=");
    return 1;
  }
  if (arg_pp.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --pp=");
    return 1;
  }
  if (arg_dep.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --dep=");
    return 1;
  }
  if (arg_obj.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --obj=");
    return 1;
  }
  if (arg_ddi.empty()) {
    cmSystemTools::Error("-E cmake_ninja_depends requires value for --ddi=");
    return 1;
  }

  std::vector<std::string> includes;
  {
    Json::Value tdio;
    Json::Value const& tdi = tdio;
    {
      cmsys::ifstream tdif(arg_tdi.c_str(), std::ios::in | std::ios::binary);
      Json::Reader reader;
      if (!reader.parse(tdif, tdio, false)) {
        cmSystemTools::Error("-E cmake_ninja_depends failed to parse ",
                             arg_tdi.c_str(),
                             reader.getFormattedErrorMessages().c_str());
        return 1;
      }
    }

    Json::Value const& tdi_include_dirs = tdi["include-dirs"];
    if (tdi_include_dirs.isArray()) {
      for (Json::Value::const_iterator i = tdi_include_dirs.begin();
           i != tdi_include_dirs.end(); ++i) {
        includes.push_back(i->asString());
      }
    }
  }

  cmFortranSourceInfo info;
  std::set<std::string> defines;
  cmFortranParser parser(includes, defines, info);
  if (!cmFortranParser_FilePush(&parser, arg_pp.c_str())) {
    cmSystemTools::Error("-E cmake_ninja_depends failed to open ",
                         arg_pp.c_str());
    return 1;
  }
  if (cmFortran_yyparse(parser.Scanner) != 0) {
    // Failed to parse the file.
    return 1;
  }

  {
    cmGeneratedFileStream depfile(arg_dep.c_str());
    depfile << cmSystemTools::ConvertToUnixOutputPath(arg_pp) << ":";
    for (std::set<std::string>::iterator i = info.Includes.begin();
         i != info.Includes.end(); ++i) {
      depfile << " \\\n " << cmSystemTools::ConvertToUnixOutputPath(*i);
    }
    depfile << "\n";
  }

  Json::Value ddi(Json::objectValue);
  ddi["object"] = arg_obj;

  Json::Value& ddi_provides = ddi["provides"] = Json::arrayValue;
  for (std::set<std::string>::iterator i = info.Provides.begin();
       i != info.Provides.end(); ++i) {
    ddi_provides.append(*i);
  }
  Json::Value& ddi_requires = ddi["requires"] = Json::arrayValue;
  for (std::set<std::string>::iterator i = info.Requires.begin();
       i != info.Requires.end(); ++i) {
    // Require modules not provided in the same source.
    if (!info.Provides.count(*i)) {
      ddi_requires.append(*i);
    }
  }

  cmGeneratedFileStream ddif(arg_ddi.c_str());
  ddif << ddi;
  if (!ddif) {
    cmSystemTools::Error("-E cmake_ninja_depends failed to write ",
                         arg_ddi.c_str());
    return 1;
  }
  return 0;
}